

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this,Static_String *sym)

{
  size_t t_distance;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ulong local_38;
  size_t pos;
  char *file_pos;
  size_t len;
  Static_String *sym_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  t_distance = utility::Static_String::size(sym);
  sVar1 = Position::remaining(&this->m_position);
  if (sVar1 < t_distance) {
    this_local._7_1_ = false;
  }
  else {
    pcVar2 = Position::operator*(&this->m_position);
    for (local_38 = 0; local_38 < t_distance; local_38 = local_38 + 1) {
      pcVar3 = utility::Static_String::c_str(sym);
      if (pcVar3[local_38] != pcVar2[local_38]) {
        return false;
      }
    }
    Position::operator+=(&this->m_position,t_distance);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline auto Symbol_(const utility::Static_String &sym) noexcept {
        const auto len = sym.size();
        if (m_position.remaining() >= len) {
          const char *file_pos = &(*m_position);
          for (size_t pos = 0; pos < len; ++pos) {
            if (sym.c_str()[pos] != file_pos[pos]) {
              return false;
            }
          }
          m_position += len;
          return true;
        }
        return false;
      }